

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int unqlitePageWrite(unqlite_page *pMyPage)

{
  Pager *pPager_00;
  int rc;
  Pager *pPager;
  Page *pPage;
  unqlite_page *pMyPage_local;
  
  pPager_00 = (Pager *)pMyPage[1].zData;
  pMyPage_local._4_4_ = unqlitePagerBegin(pPager_00);
  if ((pMyPage_local._4_4_ == 0) &&
     ((pPager_00->iState != 2 ||
      (pMyPage_local._4_4_ = unqliteOpenJournal(pPager_00), pMyPage_local._4_4_ == 0)))) {
    if ((pPager_00->nHot < 0x80) ||
       (pMyPage_local._4_4_ = pager_dirty_commit(pPager_00), pMyPage_local._4_4_ == 0)) {
      pMyPage_local._4_4_ = page_write(pPager_00,(Page *)pMyPage);
    }
    else {
      unqliteGenError(pPager_00->pDb,"Please perform a rollback");
    }
  }
  return pMyPage_local._4_4_;
}

Assistant:

static int unqlitePageWrite(unqlite_page *pMyPage)
{
	Page *pPage = (Page *)pMyPage;
	Pager *pPager = pPage->pPager;
	int rc;
	/* Begin the write transaction */
	rc = unqlitePagerBegin(pPager);
	if( rc != UNQLITE_OK ){
		return rc;
	}
	if( pPager->iState == PAGER_WRITER_LOCKED ){
		/* The journal file needs to be opened. Higher level routines have already
		 ** obtained the necessary locks to begin the write-transaction, but the
		 ** rollback journal might not yet be open. Open it now if this is the case.
		 */
		rc = unqliteOpenJournal(pPager);
		if( rc != UNQLITE_OK ){
			return rc;
		}
	}
	if( pPager->nHot > 127 ){
		/* Write hot dirty pages */
		rc = pager_dirty_commit(pPager);
		if( rc != UNQLITE_OK ){
			/* A rollback must be done */
			unqliteGenError(pPager->pDb,"Please perform a rollback");
			return rc;
		}
	}
	/* Write the page to the journal file */
	rc = page_write(pPager,pPage);
	return rc;
}